

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::UniformCase::generateBasicUniforms
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniformsDst,
          vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsDst,VarType *varType,char *varName,bool isParentActive,
          int *samplerUnitCounter,Random *rnd)

{
  uint uVar1;
  DataType DVar2;
  VarType *pVVar3;
  pointer pSVar4;
  char *name_;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint minS;
  long lVar8;
  string *this_00;
  ulong __n;
  bool bVar9;
  reference rVar10;
  int local_218;
  allocator<char> local_211;
  VarType *local_210;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  *local_208;
  StructType *local_200;
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  *local_1f8;
  UniformCase *local_1f0;
  char *local_1e8;
  int local_1dc;
  string arrayRootName;
  vector<bool,_std::allocator<bool>_> isElemActive;
  string indexedName;
  VarValue value;
  string memberFullName;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_208 = basicUniformsDst;
  local_1f8 = basicUniformReportsDst;
  local_1f0 = this;
  local_1e8 = varName;
  if (varType->m_type == TYPE_ARRAY) {
    local_200 = (StructType *)(ulong)(uint)(varType->m_data).array.size;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,SSBOArrayLengthTests::init::arraysSized + 1,
               (allocator<char> *)&isElemActive);
    std::operator+(&memberFullName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   varName);
    local_210 = varType;
    std::operator+(&arrayRootName,&memberFullName,"[0]");
    std::__cxx11::string::~string((string *)&memberFullName);
    std::__cxx11::string::~string((string *)&value);
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    isElemActive.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_1dc = (int)((long)((ulong)(uint)((int)local_200 >> 0x1f) << 0x20 |
                            (ulong)local_200 & 0xffffffff) / 2);
    local_218 = 0;
    while( true ) {
      pVVar3 = local_210;
      uVar1 = (local_210->m_data).array.size;
      uVar7 = (ulong)uVar1;
      if ((int)uVar1 <= local_218) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,SSBOArrayLengthTests::init::arraysSized + 1,&local_211);
      std::operator+(&local_50,&local_70,varName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                     &local_50,"[");
      de::toString<int>(&local_90,&local_218);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &memberFullName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                     &local_90);
      std::operator+(&indexedName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &memberFullName,"]");
      std::__cxx11::string::~string((string *)&memberFullName);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if ((isParentActive) &&
         ((uVar1 = *(uint *)&(local_1f0->super_CallLogWrapper).field_0x14, (uVar1 & 0x20) == 0 ||
          ((((long)(local_208->
                   super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_208->
                  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x98 & 1U) == 0)))) {
        bVar9 = true;
        if ((uVar1 & 1) != 0) {
          bVar9 = local_218 == local_1dc;
        }
      }
      else {
        bVar9 = false;
      }
      std::vector<bool,_std::allocator<bool>_>::push_back(&isElemActive,bVar9);
      pVVar3 = (local_210->m_data).array.elementType;
      if (pVVar3->m_type == TYPE_BASIC) {
        DVar2 = (pVVar3->m_data).basic.type;
        iVar5 = -1;
        if (DVar2 - TYPE_SAMPLER_1D < 0x1e) {
          iVar5 = *samplerUnitCounter;
          *samplerUnitCounter = iVar5 + 1;
        }
        generateRandomVarValue(&value,DVar2,rnd,iVar5);
        BasicUniform::BasicUniform
                  ((BasicUniform *)&memberFullName,indexedName._M_dataplus._M_p,DVar2,bVar9,&value,
                   arrayRootName._M_dataplus._M_p,local_218,(int)local_200);
        std::
        vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
        ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniform>
                  (local_208,(BasicUniform *)&memberFullName);
        varName = local_1e8;
        BasicUniform::~BasicUniform((BasicUniform *)&memberFullName);
      }
      else {
        generateBasicUniforms
                  (local_1f0,local_208,local_1f8,pVVar3,indexedName._M_dataplus._M_p,bVar9,
                   samplerUnitCounter,rnd);
      }
      std::__cxx11::string::~string((string *)&indexedName);
      local_218 = local_218 + 1;
    }
    if (((local_210->m_data).array.elementType)->m_type == TYPE_BASIC) {
      __n = uVar7;
      do {
        __n = __n - 1;
        uVar6 = (uint)uVar7;
        minS = (int)uVar1 >> 0x1f & uVar1;
        if ((int)uVar6 < 1) break;
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&isElemActive,__n);
        uVar7 = (ulong)(uVar6 - 1);
        minS = uVar6;
      } while ((*rVar10._M_p & rVar10._M_mask) == 0);
      BasicUniformReportRef::BasicUniformReportRef
                ((BasicUniformReportRef *)&memberFullName,arrayRootName._M_dataplus._M_p,minS,
                 (int)local_200,(((pVVar3->m_data).array.elementType)->m_data).basic.type,
                 0 < (int)uVar6 && isParentActive);
      std::
      vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
      ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>
                (local_1f8,(BasicUniformReportRef *)&memberFullName);
      std::__cxx11::string::~string((string *)&memberFullName);
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&isElemActive.super__Bvector_base<std::allocator<bool>_>);
    this_00 = &arrayRootName;
  }
  else {
    if (varType->m_type != TYPE_BASIC) {
      local_200 = (varType->m_data).structPtr;
      local_210 = (VarType *)0x20;
      for (lVar8 = 0;
          pSVar4 = (local_200->m_members).
                   super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl
                   .super__Vector_impl_data._M_start,
          lVar8 < (int)(((long)(local_200->m_members).
                               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) / 0x38);
          lVar8 = lVar8 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&arrayRootName,SSBOArrayLengthTests::init::arraysSized + 1,
                   (allocator<char> *)&indexedName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &isElemActive,&arrayRootName,local_1e8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &isElemActive,".");
        pVVar3 = local_210;
        std::operator+(&memberFullName,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       *(char **)((long)pSVar4 + (long)local_210 + -0x20));
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&isElemActive);
        std::__cxx11::string::~string((string *)&arrayRootName);
        generateBasicUniforms
                  (local_1f0,local_208,local_1f8,
                   (VarType *)((long)&(pSVar4->m_name)._M_dataplus._M_p + (long)pVVar3),
                   memberFullName._M_dataplus._M_p,isParentActive,samplerUnitCounter,rnd);
        std::__cxx11::string::~string((string *)&memberFullName);
        local_210 = (VarType *)((long)pVVar3 + 0x38);
      }
      return;
    }
    if (isParentActive) {
      bVar9 = true;
      if (((this->super_CallLogWrapper).field_0x14 & 0x20) != 0) {
        bVar9 = (((long)(basicUniformsDst->
                        super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(basicUniformsDst->
                       super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x98 & 1U) == 0;
      }
    }
    else {
      bVar9 = false;
    }
    DVar2 = (varType->m_data).basic.type;
    if (DVar2 - TYPE_SAMPLER_1D < 0x1e) {
      iVar5 = *samplerUnitCounter;
      *samplerUnitCounter = iVar5 + 1;
    }
    else {
      iVar5 = -1;
    }
    generateRandomVarValue(&value,DVar2,rnd,iVar5);
    name_ = local_1e8;
    BasicUniform::BasicUniform
              ((BasicUniform *)&memberFullName,local_1e8,(varType->m_data).basic.type,bVar9,&value,
               (char *)0x0,-1,1);
    std::
    vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
    ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniform>
              (local_208,(BasicUniform *)&memberFullName);
    BasicUniform::~BasicUniform((BasicUniform *)&memberFullName);
    BasicUniformReportRef::BasicUniformReportRef
              ((BasicUniformReportRef *)&memberFullName,name_,(varType->m_data).basic.type,bVar9);
    std::
    vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
    ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>
              (local_1f8,(BasicUniformReportRef *)&memberFullName);
    this_00 = &memberFullName;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void UniformCase::generateBasicUniforms (vector<BasicUniform>& basicUniformsDst, vector<BasicUniformReportRef>& basicUniformReportsDst, const glu::VarType& varType, const char* const varName, const bool isParentActive, int& samplerUnitCounter, Random& rnd) const
{
	if (varType.isBasicType())
	{
		const bool				isActive	= isParentActive && (m_features & FEATURE_UNIFORMUSAGE_EVERY_OTHER ? basicUniformsDst.size() % 2 == 0 : true);
		const glu::DataType		type		= varType.getBasicType();
		const VarValue			value		= glu::isDataTypeSampler(type) ? generateRandomVarValue(type, rnd, samplerUnitCounter++)
																		   : generateRandomVarValue(varType.getBasicType(), rnd);

		basicUniformsDst.push_back(BasicUniform(varName, varType.getBasicType(), isActive, value));
		basicUniformReportsDst.push_back(BasicUniformReportRef(varName, varType.getBasicType(), isActive));
	}
	else if (varType.isArrayType())
	{
		const int		size			= varType.getArraySize();
		const string	arrayRootName	= string("") + varName + "[0]";
		vector<bool>	isElemActive;

		for (int elemNdx = 0; elemNdx < varType.getArraySize(); elemNdx++)
		{
			const string	indexedName		= string("") + varName + "[" + de::toString(elemNdx) + "]";
			const bool		isCurElemActive	= isParentActive																						&&
											  (m_features & FEATURE_UNIFORMUSAGE_EVERY_OTHER			? basicUniformsDst.size() % 2 == 0	: true)	&&
											  (m_features & FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX		? elemNdx == size/2					: true);

			isElemActive.push_back(isCurElemActive);

			if (varType.getElementType().isBasicType())
			{
				// \note We don't want separate entries in basicUniformReportsDst for elements of basic-type arrays.
				const glu::DataType	elemBasicType	= varType.getElementType().getBasicType();
				const VarValue		value			= glu::isDataTypeSampler(elemBasicType) ? generateRandomVarValue(elemBasicType, rnd, samplerUnitCounter++)
																							: generateRandomVarValue(elemBasicType, rnd);

				basicUniformsDst.push_back(BasicUniform(indexedName.c_str(), elemBasicType, isCurElemActive, value, arrayRootName.c_str(), elemNdx, size));
			}
			else
				generateBasicUniforms(basicUniformsDst, basicUniformReportsDst, varType.getElementType(), indexedName.c_str(), isCurElemActive, samplerUnitCounter, rnd);
		}

		if (varType.getElementType().isBasicType())
		{
			int minSize;
			for (minSize = varType.getArraySize(); minSize > 0 && !isElemActive[minSize-1]; minSize--);

			basicUniformReportsDst.push_back(BasicUniformReportRef(arrayRootName.c_str(), minSize, size, varType.getElementType().getBasicType(), isParentActive && minSize > 0));
		}
	}
	else
	{
		DE_ASSERT(varType.isStructType());

		const StructType& structType = *varType.getStructPtr();

		for (int i = 0; i < structType.getNumMembers(); i++)
		{
			const glu::StructMember&	member			= structType.getMember(i);
			const string				memberFullName	= string("") + varName + "." + member.getName();

			generateBasicUniforms(basicUniformsDst, basicUniformReportsDst, member.getType(), memberFullName.c_str(), isParentActive, samplerUnitCounter, rnd);
		}
	}
}